

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase124::run(TestCase124 *this)

{
  void *pvVar1;
  DebugComparison<int_*,_int_*> _kjCondition;
  int *local_38;
  int *local_30;
  Arena arena;
  
  Arena::Arena(&arena,0x400);
  pvVar1 = Arena::allocateBytes(&arena,0x40,4,false);
  _kjCondition.right = (int *)Arena::allocateBytes(&arena,0x20,4,false);
  _kjCondition.left = (int *)((long)pvVar1 + 0x40);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == _kjCondition.right;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    local_38 = _kjCondition.right;
    local_30 = _kjCondition.left;
    kj::_::Debug::log<char_const(&)[48],kj::_::DebugComparison<int*,int*>&,int*,int*>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/arena-test.c++"
               ,0x82,ERROR,
               "\"failed: expected \" \"(arr1.end()) == (arr2.begin())\", _kjCondition, arr1.end(), arr2.begin()"
               ,(char (*) [48])"failed: expected (arr1.end()) == (arr2.begin())",&_kjCondition,
               &local_30,&local_38);
  }
  Arena::~Arena(&arena);
  return;
}

Assistant:

TEST(Arena, TrivialArray) {
  Arena arena;
  ArrayPtr<int> arr1 = arena.allocateArray<int>(16);
  ArrayPtr<int> arr2 = arena.allocateArray<int>(8);

  // Trivial arrays should be tightly-packed.
  EXPECT_EQ(arr1.end(), arr2.begin());
}